

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O0

void Ivy_ManHaigCreateObj(Ivy_Man_t *p,Ivy_Obj_t *pObj)

{
  int iVar1;
  Ivy_Type_t IVar2;
  Ivy_Obj_t *pIVar3;
  Ivy_Obj_t *pIVar4;
  Ivy_Obj_t *pIVar5;
  Ivy_Obj_t *pEquiv1;
  Ivy_Obj_t *pEquiv0;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *p_local;
  
  if (p->pHaig == (Ivy_Man_t *)0x0) {
    __assert_fail("p->pHaig != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyHaig.c"
                  ,0xba,"void Ivy_ManHaigCreateObj(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  iVar1 = Ivy_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyHaig.c"
                  ,0xbb,"void Ivy_ManHaigCreateObj(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  IVar2 = Ivy_ObjType(pObj);
  if (IVar2 == IVY_BUF) {
    pIVar3 = Ivy_ObjChild0Equiv(pObj);
    pObj->pEquiv = pIVar3;
  }
  else {
    IVar2 = Ivy_ObjType(pObj);
    if (IVar2 == IVY_LATCH) {
      pIVar3 = Ivy_ObjChild0Equiv(pObj);
      pIVar4 = Ivy_Regular(pIVar3);
      pIVar4 = Ivy_HaigObjRepr(pIVar4);
      iVar1 = Ivy_IsComplement(pIVar3);
      pIVar3 = Ivy_NotCond(pIVar4,iVar1);
      pIVar3 = Ivy_Latch(p->pHaig,pIVar3,*(uint *)&pObj->field_0x8 >> 9 & IVY_INIT_DC);
      pObj->pEquiv = pIVar3;
    }
    else {
      IVar2 = Ivy_ObjType(pObj);
      if (IVar2 != IVY_AND) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyHaig.c"
                      ,0xce,"void Ivy_ManHaigCreateObj(Ivy_Man_t *, Ivy_Obj_t *)");
      }
      pIVar3 = Ivy_ObjChild0Equiv(pObj);
      pIVar4 = Ivy_Regular(pIVar3);
      pIVar4 = Ivy_HaigObjRepr(pIVar4);
      iVar1 = Ivy_IsComplement(pIVar3);
      pIVar3 = Ivy_NotCond(pIVar4,iVar1);
      pIVar4 = Ivy_ObjChild1Equiv(pObj);
      pIVar5 = Ivy_Regular(pIVar4);
      pIVar5 = Ivy_HaigObjRepr(pIVar5);
      iVar1 = Ivy_IsComplement(pIVar4);
      pIVar4 = Ivy_NotCond(pIVar5,iVar1);
      pIVar3 = Ivy_And(p->pHaig,pIVar3,pIVar4);
      pObj->pEquiv = pIVar3;
    }
  }
  return;
}

Assistant:

void Ivy_ManHaigCreateObj( Ivy_Man_t * p, Ivy_Obj_t * pObj )
{
    Ivy_Obj_t * pEquiv0, * pEquiv1;
    assert( p->pHaig != NULL );
    assert( !Ivy_IsComplement(pObj) );
    if ( Ivy_ObjType(pObj) == IVY_BUF )
        pObj->pEquiv = Ivy_ObjChild0Equiv(pObj);
    else if ( Ivy_ObjType(pObj) == IVY_LATCH )
    {
//        pObj->pEquiv = Ivy_Latch( p->pHaig, Ivy_ObjChild0Equiv(pObj), pObj->Init );
        pEquiv0 = Ivy_ObjChild0Equiv(pObj);
        pEquiv0 = Ivy_NotCond( Ivy_HaigObjRepr(Ivy_Regular(pEquiv0)), Ivy_IsComplement(pEquiv0) );
        pObj->pEquiv = Ivy_Latch( p->pHaig, pEquiv0, (Ivy_Init_t)pObj->Init );
    }
    else if ( Ivy_ObjType(pObj) == IVY_AND )
    {
//        pObj->pEquiv = Ivy_And( p->pHaig, Ivy_ObjChild0Equiv(pObj), Ivy_ObjChild1Equiv(pObj) );
        pEquiv0 = Ivy_ObjChild0Equiv(pObj);
        pEquiv0 = Ivy_NotCond( Ivy_HaigObjRepr(Ivy_Regular(pEquiv0)), Ivy_IsComplement(pEquiv0) );
        pEquiv1 = Ivy_ObjChild1Equiv(pObj);
        pEquiv1 = Ivy_NotCond( Ivy_HaigObjRepr(Ivy_Regular(pEquiv1)), Ivy_IsComplement(pEquiv1) );
        pObj->pEquiv = Ivy_And( p->pHaig, pEquiv0, pEquiv1 );
    }
    else assert( 0 );
    // make sure the node points to the representative
//    pObj->pEquiv = Ivy_NotCond( Ivy_HaigObjRepr(Ivy_Regular(pObj->pEquiv)), Ivy_IsComplement(pObj->pEquiv) );
}